

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O2

bool __thiscall cmCTestBZR::LoadModifications(cmCTestBZR *this)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_32a;
  allocator<char> local_329;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bzr_status;
  string local_310;
  string bzr;
  OutputLogger err;
  StatusParser out;
  
  std::__cxx11::string::string
            ((string *)&bzr,(string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool
            );
  std::__cxx11::string::string((string *)&out,(string *)&bzr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out.super_LineParser.Line._M_string_length,"status",(allocator<char> *)&err)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&out.BZR,"-SV",&local_329);
  __l._M_len = 3;
  __l._M_array = (iterator)&out;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&bzr_status,__l,&local_32a);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)out.RegexStatus.regmatch.startp + lVar1 + -0x48))
    ;
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  StatusParser::StatusParser(&out,this,"status-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"status-err> ");
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  local_310._M_string_length = 0;
  local_310.field_2._M_local_buf[0] = '\0';
  cmCTestVC::RunChild((cmCTestVC *)this,&bzr_status,(OutputParser *)&out,(OutputParser *)&err,
                      &local_310,Auto);
  std::__cxx11::string::~string((string *)&local_310);
  cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
  StatusParser::~StatusParser(&out);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&bzr_status);
  std::__cxx11::string::~string((string *)&bzr);
  return true;
}

Assistant:

bool cmCTestBZR::LoadModifications()
{
  // Run "bzr status" which reports local modifications.
  std::string bzr = this->CommandLineTool;
  std::vector<std::string> bzr_status = { bzr, "status", "-SV" };
  StatusParser out(this, "status-out> ");
  OutputLogger err(this->Log, "status-err> ");
  this->RunChild(bzr_status, &out, &err);
  return true;
}